

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

_Bool sysbvm_type_isDirectSubtypeOf(sysbvm_tuple_t type,sysbvm_tuple_t supertype)

{
  _Bool _Var1;
  
  if ((((supertype & 0xf) == 0 && supertype != 0) && ((type & 0xf) == 0 && type != 0)) &&
     (_Var1 = sysbvm_tuple_isDummyValue(type), !_Var1)) {
    while( true ) {
      if (type == supertype) {
        return type != 0;
      }
      if (type == 0) break;
      type = *(sysbvm_tuple_t *)(type + 0x30);
    }
    return type != 0;
  }
  return false;
}

Assistant:

SYSBVM_INLINE bool sysbvm_type_isDirectSubtypeOf(sysbvm_tuple_t type, sysbvm_tuple_t supertype)
{
    if(!sysbvm_tuple_isNonNullPointer(supertype)) return false;
    if(!sysbvm_tuple_isNonNullPointer(type)) return false;
    if(sysbvm_tuple_isDummyValue(type)) return false;

    while(type)
    {
        if(type == supertype)
            return true;

        type = ((sysbvm_type_tuple_t *)type)->supertype;
    }

    return false;
}